

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_avx2_256_8.c
# Opt level: O3

parasail_result_t *
parasail_nw_rowcol_scan_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  longlong *plVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  int *piVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  __m256i alVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  longlong lVar30;
  longlong lVar31;
  uint uVar32;
  int iVar33;
  parasail_result_t *ppVar34;
  __m256i *ptr;
  int8_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  char cVar35;
  int iVar36;
  int iVar37;
  ulong uVar38;
  __m256i *palVar39;
  ulong size;
  uint uVar40;
  __m256i *palVar41;
  long lVar42;
  int iVar43;
  long lVar44;
  ulong uVar45;
  char cVar46;
  byte bVar47;
  uint uVar48;
  undefined1 uVar49;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  undefined1 local_278 [32];
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 auVar76 [64];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_rowcol_scan_profile_avx2_256_8_cold_8();
  }
  else {
    pvVar2 = (profile->profile8).score;
    if (pvVar2 == (void *)0x0) {
      parasail_nw_rowcol_scan_profile_avx2_256_8_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_nw_rowcol_scan_profile_avx2_256_8_cold_6();
      }
      else {
        uVar40 = profile->s1Len;
        if ((int)uVar40 < 1) {
          parasail_nw_rowcol_scan_profile_avx2_256_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_rowcol_scan_profile_avx2_256_8_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_rowcol_scan_profile_avx2_256_8_cold_3();
        }
        else if (open < 0) {
          parasail_nw_rowcol_scan_profile_avx2_256_8_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_rowcol_scan_profile_avx2_256_8_cold_1();
        }
        else {
          uVar32 = uVar40 - 1;
          size = (ulong)uVar40 + 0x1f >> 5;
          uVar5 = (ulong)uVar32 % size;
          iVar33 = (int)(uVar32 / size);
          iVar36 = ppVar3->min;
          local_158._4_4_ = -open;
          uVar48 = (uint)(byte)-(char)iVar36;
          if (iVar36 != local_158._4_4_ && SBORROW4(iVar36,local_158._4_4_) == iVar36 + open < 0) {
            uVar48 = open;
          }
          cVar46 = '~' - (char)ppVar3->max;
          ppVar34 = parasail_result_new_rowcol1((uint)((ulong)uVar40 + 0x1f) & 0x7fffffe0,s2Len);
          if (ppVar34 != (parasail_result_t *)0x0) {
            ppVar34->flag = ppVar34->flag | 0x20140401;
            ptr = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign_int8_t(0x20,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m256i(0x20,size);
            ptr_02 = parasail_memalign___m256i(0x20,size);
            ptr_03 = parasail_memalign___m256i(0x20,size);
            if (ptr_03 != (__m256i *)0x0 &&
                ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                (ptr_00 != (int8_t *)0x0 && ptr != (__m256i *)0x0))) {
              iVar36 = s2Len + -1;
              uVar49 = (undefined1)open;
              auVar56[1] = uVar49;
              auVar56[0] = uVar49;
              auVar56[2] = uVar49;
              auVar56[3] = uVar49;
              auVar56[4] = uVar49;
              auVar56[5] = uVar49;
              auVar56[6] = uVar49;
              auVar56[7] = uVar49;
              auVar56[8] = uVar49;
              auVar56[9] = uVar49;
              auVar56[10] = uVar49;
              auVar56[0xb] = uVar49;
              auVar56[0xc] = uVar49;
              auVar56[0xd] = uVar49;
              auVar56[0xe] = uVar49;
              auVar56[0xf] = uVar49;
              auVar56[0x10] = uVar49;
              auVar56[0x11] = uVar49;
              auVar56[0x12] = uVar49;
              auVar56[0x13] = uVar49;
              auVar56[0x14] = uVar49;
              auVar56[0x15] = uVar49;
              auVar56[0x16] = uVar49;
              auVar56[0x17] = uVar49;
              auVar56[0x18] = uVar49;
              auVar56[0x19] = uVar49;
              auVar56[0x1a] = uVar49;
              auVar56[0x1b] = uVar49;
              auVar56[0x1c] = uVar49;
              auVar56[0x1d] = uVar49;
              auVar56[0x1e] = uVar49;
              auVar56[0x1f] = uVar49;
              cVar35 = (char)gap;
              auVar57[1] = cVar35;
              auVar57[0] = cVar35;
              auVar57[2] = cVar35;
              auVar57[3] = cVar35;
              auVar57[4] = cVar35;
              auVar57[5] = cVar35;
              auVar57[6] = cVar35;
              auVar57[7] = cVar35;
              auVar57[8] = cVar35;
              auVar57[9] = cVar35;
              auVar57[10] = cVar35;
              auVar57[0xb] = cVar35;
              auVar57[0xc] = cVar35;
              auVar57[0xd] = cVar35;
              auVar57[0xe] = cVar35;
              auVar57[0xf] = cVar35;
              auVar57[0x10] = cVar35;
              auVar57[0x11] = cVar35;
              auVar57[0x12] = cVar35;
              auVar57[0x13] = cVar35;
              auVar57[0x14] = cVar35;
              auVar57[0x15] = cVar35;
              auVar57[0x16] = cVar35;
              auVar57[0x17] = cVar35;
              auVar57[0x18] = cVar35;
              auVar57[0x19] = cVar35;
              auVar57[0x1a] = cVar35;
              auVar57[0x1b] = cVar35;
              auVar57[0x1c] = cVar35;
              auVar57[0x1d] = cVar35;
              auVar57[0x1e] = cVar35;
              auVar57[0x1f] = cVar35;
              bVar47 = (char)uVar48 + 0x81;
              cVar35 = -((char)size * cVar35);
              auVar50[1] = cVar35;
              auVar50[0] = cVar35;
              auVar50[2] = cVar35;
              auVar50[3] = cVar35;
              auVar50[4] = cVar35;
              auVar50[5] = cVar35;
              auVar50[6] = cVar35;
              auVar50[7] = cVar35;
              auVar50[8] = cVar35;
              auVar50[9] = cVar35;
              auVar50[10] = cVar35;
              auVar50[0xb] = cVar35;
              auVar50[0xc] = cVar35;
              auVar50[0xd] = cVar35;
              auVar50[0xe] = cVar35;
              auVar50[0xf] = cVar35;
              auVar50[0x10] = cVar35;
              auVar50[0x11] = cVar35;
              auVar50[0x12] = cVar35;
              auVar50[0x13] = cVar35;
              auVar50[0x14] = cVar35;
              auVar50[0x15] = cVar35;
              auVar50[0x16] = cVar35;
              auVar50[0x17] = cVar35;
              auVar50[0x18] = cVar35;
              auVar50[0x19] = cVar35;
              auVar50[0x1a] = cVar35;
              auVar50[0x1b] = cVar35;
              auVar50[0x1c] = cVar35;
              auVar50[0x1d] = cVar35;
              auVar50[0x1e] = cVar35;
              auVar50[0x1f] = cVar35;
              auVar50 = vpand_avx2(auVar50,_DAT_00908f00);
              auVar50 = vpaddsb_avx2(ZEXT132(bVar47),auVar50);
              auVar52._4_4_ = 0;
              auVar52._0_4_ = open;
              auVar51._4_4_ = 0;
              auVar51._0_4_ = gap;
              local_1d8._8_8_ = SEXT48((int)local_158._4_4_);
              auVar51._8_4_ = gap;
              auVar51._12_4_ = 0;
              auVar51._16_4_ = gap;
              auVar51._20_4_ = 0;
              auVar51._24_4_ = gap;
              auVar51._28_4_ = 0;
              auVar59._8_8_ = size;
              auVar59._0_8_ = size;
              auVar59._16_8_ = size;
              auVar59._24_8_ = size;
              auVar8 = vpmuldq_avx2(auVar59,_DAT_00908f20);
              auVar9 = vpmuldq_avx2(auVar59,_DAT_00908f40);
              auVar62 = vpmuldq_avx2(auVar59,_DAT_00908f60);
              auVar10 = vpmuldq_avx2(auVar59,_DAT_00908f80);
              auVar54 = vpmuldq_avx2(auVar59,_DAT_00908e00);
              auVar63 = vpmuldq_avx2(auVar59,_DAT_00908e20);
              auVar64 = vpmuldq_avx2(auVar59,_DAT_00908c60);
              local_1d8._0_8_ = local_1d8._8_8_;
              local_1d8._16_8_ = local_1d8._8_8_;
              local_1d8._24_8_ = local_1d8._8_8_;
              auVar59 = vpmuldq_avx2(auVar59,_DAT_00908b60);
              auVar52._8_4_ = open;
              auVar52._12_4_ = 0;
              auVar52._16_4_ = open;
              auVar52._20_4_ = 0;
              auVar52._24_4_ = open;
              auVar52._28_4_ = 0;
              uVar38 = 0;
              auVar75._8_8_ = 0xffffffffffffff80;
              auVar75._0_8_ = 0xffffffffffffff80;
              auVar75._16_8_ = 0xffffffffffffff80;
              auVar75._24_8_ = 0xffffffffffffff80;
              auVar76 = ZEXT3264(auVar75);
              auVar77._8_8_ = 0xff;
              auVar77._0_8_ = 0xff;
              auVar77._16_8_ = 0xff;
              auVar77._24_8_ = 0xff;
              palVar39 = ptr_02;
              palVar41 = ptr;
              do {
                auVar61._8_8_ = uVar38;
                auVar61._0_8_ = uVar38;
                auVar61._16_8_ = uVar38;
                auVar61._24_8_ = uVar38;
                auVar53 = vpaddq_avx2(auVar61,auVar64);
                auVar60 = vpaddq_avx2(auVar61,auVar59);
                auVar65 = vpaddq_avx2(auVar61,auVar63);
                auVar66 = vpaddq_avx2(auVar61,auVar54);
                auVar71 = vpaddq_avx2(auVar61,auVar10);
                auVar72 = vpaddq_avx2(auVar61,auVar62);
                auVar73 = vpaddq_avx2(auVar61,auVar9);
                auVar61 = vpaddq_avx2(auVar61,auVar8);
                auVar11 = vpmuludq_avx2(auVar61,auVar51);
                auVar61 = vpsrlq_avx2(auVar61,0x20);
                auVar61 = vpmuludq_avx2(auVar61,auVar51);
                auVar61 = vpsllq_avx2(auVar61,0x20);
                auVar61 = vpaddq_avx2(auVar11,auVar61);
                auVar11 = vpmuludq_avx2(auVar73,auVar51);
                auVar73 = vpsrlq_avx2(auVar73,0x20);
                auVar73 = vpmuludq_avx2(auVar73,auVar51);
                auVar73 = vpsllq_avx2(auVar73,0x20);
                auVar73 = vpaddq_avx2(auVar73,auVar11);
                auVar11 = vpmuludq_avx2(auVar72,auVar51);
                auVar72 = vpsrlq_avx2(auVar72,0x20);
                auVar72 = vpmuludq_avx2(auVar72,auVar51);
                auVar72 = vpsllq_avx2(auVar72,0x20);
                auVar72 = vpaddq_avx2(auVar11,auVar72);
                auVar11 = vpmuludq_avx2(auVar71,auVar51);
                auVar71 = vpsrlq_avx2(auVar71,0x20);
                auVar71 = vpmuludq_avx2(auVar71,auVar51);
                auVar71 = vpsllq_avx2(auVar71,0x20);
                auVar71 = vpaddq_avx2(auVar11,auVar71);
                auVar11 = vpmuludq_avx2(auVar66,auVar51);
                auVar66 = vpsrlq_avx2(auVar66,0x20);
                auVar66 = vpmuludq_avx2(auVar66,auVar51);
                auVar66 = vpsllq_avx2(auVar66,0x20);
                auVar66 = vpaddq_avx2(auVar11,auVar66);
                auVar11 = vpmuludq_avx2(auVar65,auVar51);
                auVar65 = vpsrlq_avx2(auVar65,0x20);
                auVar65 = vpmuludq_avx2(auVar65,auVar51);
                auVar65 = vpsllq_avx2(auVar65,0x20);
                auVar65 = vpaddq_avx2(auVar11,auVar65);
                auVar11 = vpmuludq_avx2(auVar60,auVar51);
                auVar60 = vpsrlq_avx2(auVar60,0x20);
                auVar60 = vpmuludq_avx2(auVar60,auVar51);
                auVar60 = vpsllq_avx2(auVar60,0x20);
                auVar60 = vpaddq_avx2(auVar11,auVar60);
                auVar11 = vpmuludq_avx2(auVar53,auVar51);
                auVar53 = vpsrlq_avx2(auVar53,0x20);
                auVar53 = vpmuludq_avx2(auVar53,auVar51);
                auVar53 = vpsllq_avx2(auVar53,0x20);
                auVar53 = vpaddq_avx2(auVar11,auVar53);
                auVar12 = vpsubq_avx2(local_1d8,auVar53);
                auVar13 = vpsubq_avx2(local_1d8,auVar60);
                auVar14 = vpsubq_avx2(local_1d8,auVar65);
                auVar15 = vpsubq_avx2(local_1d8,auVar66);
                auVar61 = vpsubq_avx2(local_1d8,auVar61);
                auVar53 = vpcmpgtq_avx2(auVar61,auVar75);
                auVar65 = vblendvpd_avx(auVar75,auVar61,auVar53);
                auVar16 = vpsubq_avx2(local_1d8,auVar71);
                auVar53 = vpcmpgtq_avx2(auVar15,auVar75);
                auVar66 = vblendvpd_avx(auVar75,auVar15,auVar53);
                auVar72 = vpsubq_avx2(local_1d8,auVar72);
                auVar53 = vpcmpgtq_avx2(auVar13,auVar75);
                auVar60 = vblendvpd_avx(auVar75,auVar13,auVar53);
                auVar73 = vpsubq_avx2(local_1d8,auVar73);
                auVar53 = vpcmpgtq_avx2(auVar12,auVar75);
                auVar53 = vblendvpd_avx(auVar75,auVar12,auVar53);
                auVar53 = vandpd_avx(auVar53,auVar77);
                auVar60 = vandpd_avx(auVar60,auVar77);
                auVar71 = vpackusdw_avx2(auVar60,auVar53);
                auVar53 = vpcmpgtq_avx2(auVar14,auVar75);
                auVar53 = vblendvpd_avx(auVar75,auVar14,auVar53);
                auVar53 = vandpd_avx(auVar53,auVar77);
                auVar60 = vandpd_avx(auVar66,auVar77);
                auVar53 = vpackusdw_avx2(auVar53,auVar60);
                auVar60 = vpcmpgtq_avx2(auVar72,auVar75);
                auVar60 = vblendvpd_avx(auVar75,auVar72,auVar60);
                auVar66 = vpermq_avx2(auVar71,0xd8);
                auVar53 = vpermq_avx2(auVar53,0xd8);
                auVar11 = vpackusdw_avx2(auVar66,auVar53);
                auVar53 = vpcmpgtq_avx2(auVar16,auVar75);
                auVar53 = vblendvpd_avx(auVar75,auVar16,auVar53);
                auVar53 = vandpd_avx(auVar53,auVar77);
                auVar60 = vandpd_avx(auVar60,auVar77);
                auVar66 = vpackusdw_avx2(auVar53,auVar60);
                auVar53 = vpcmpgtq_avx2(auVar73,auVar75);
                auVar53 = vblendvpd_avx(auVar75,auVar73,auVar53);
                auVar53 = vandpd_avx(auVar53,auVar77);
                auVar60 = vandpd_avx(auVar77,auVar65);
                auVar53 = vpackusdw_avx2(auVar53,auVar60);
                auVar60 = vpermq_avx2(auVar66,0xd8);
                auVar53 = vpermq_avx2(auVar53,0xd8);
                auVar7 = vpackusdw_avx2(auVar60,auVar53);
                auVar12 = vpsubq_avx2(auVar12,auVar52);
                auVar60 = vpsubq_avx2(auVar13,auVar52);
                auVar65 = vpsubq_avx2(auVar61,auVar52);
                auVar53 = vpcmpgtq_avx2(auVar65,auVar75);
                auVar66 = vblendvpd_avx(auVar75,auVar65,auVar53);
                auVar65 = vpsubq_avx2(auVar73,auVar52);
                auVar53 = vpcmpgtq_avx2(auVar65,auVar75);
                auVar71 = vblendvpd_avx(auVar75,auVar65,auVar53);
                auVar65 = vpsubq_avx2(auVar72,auVar52);
                auVar53 = vpcmpgtq_avx2(auVar65,auVar75);
                auVar72 = vblendvpd_avx(auVar75,auVar65,auVar53);
                auVar65 = vpsubq_avx2(auVar16,auVar52);
                auVar53 = vpcmpgtq_avx2(auVar65,auVar75);
                auVar73 = vblendvpd_avx(auVar75,auVar65,auVar53);
                auVar65 = vpsubq_avx2(auVar15,auVar52);
                auVar53 = vpcmpgtq_avx2(auVar65,auVar75);
                auVar65 = vblendvpd_avx(auVar75,auVar65,auVar53);
                auVar61 = vpsubq_avx2(auVar14,auVar52);
                auVar53 = vpcmpgtq_avx2(auVar61,auVar75);
                auVar61 = vblendvpd_avx(auVar75,auVar61,auVar53);
                auVar53 = vpcmpgtq_avx2(auVar60,auVar75);
                auVar60 = vblendvpd_avx(auVar75,auVar60,auVar53);
                auVar53 = vpcmpgtq_avx2(auVar12,auVar75);
                auVar53 = vblendvpd_avx(auVar75,auVar12,auVar53);
                auVar11 = vpermq_avx2(auVar11,0xd8);
                auVar7 = vpermq_avx2(auVar7,0xd8);
                auVar7 = vpackuswb_avx2(auVar11,auVar7);
                auVar53 = vandpd_avx(auVar53,auVar77);
                auVar60 = vandpd_avx(auVar60,auVar77);
                auVar11 = vpackusdw_avx2(auVar60,auVar53);
                auVar60 = vandpd_avx(auVar77,auVar61);
                auVar65 = vandpd_avx(auVar77,auVar65);
                auVar60 = vpackusdw_avx2(auVar60,auVar65);
                auVar65 = vpermq_avx2(auVar11,0xd8);
                auVar60 = vpermq_avx2(auVar60,0xd8);
                auVar61 = vpackusdw_avx2(auVar65,auVar60);
                auVar60 = vandpd_avx(auVar77,auVar73);
                auVar65 = vandpd_avx(auVar72,auVar77);
                auVar72 = vpackusdw_avx2(auVar60,auVar65);
                auVar60 = vandpd_avx(auVar77,auVar71);
                auVar65 = vandpd_avx(auVar77,auVar66);
                auVar60 = vpackusdw_avx2(auVar60,auVar65);
                auVar65 = vpermq_avx2(auVar72,0xd8);
                auVar60 = vpermq_avx2(auVar60,0xd8);
                auVar60 = vpackusdw_avx2(auVar65,auVar60);
                alVar17 = (__m256i)vpermq_avx2(auVar7,0xd8);
                *palVar39 = alVar17;
                auVar65 = vpermq_avx2(auVar61,0xd8);
                auVar60 = vpermq_avx2(auVar60,0xd8);
                auVar60 = vpackuswb_avx2(auVar65,auVar60);
                alVar17 = (__m256i)vpermq_avx2(auVar60,0xd8);
                *palVar41 = alVar17;
                uVar38 = uVar38 + 1;
                palVar41 = palVar41 + 1;
                palVar39 = palVar39 + 1;
              } while (size != uVar38);
              *ptr_00 = '\0';
              lVar42 = (ulong)(uint)s2Len - 1;
              auVar58._8_8_ = lVar42;
              auVar58._0_8_ = lVar42;
              auVar63._16_8_ = lVar42;
              auVar63._0_16_ = auVar58;
              auVar63._24_8_ = lVar42;
              local_138._4_4_ = gap;
              local_138._0_4_ = gap;
              local_138._8_4_ = gap;
              local_138._12_4_ = gap;
              local_138._16_4_ = gap;
              local_138._20_4_ = gap;
              local_138._24_4_ = gap;
              local_138._28_4_ = gap;
              local_158._0_4_ = local_158._4_4_;
              local_158._8_4_ = local_158._4_4_;
              local_158._12_4_ = local_158._4_4_;
              local_158._16_4_ = local_158._4_4_;
              local_158._20_4_ = local_158._4_4_;
              local_158._24_4_ = local_158._4_4_;
              local_158._28_4_ = local_158._4_4_;
              auVar62 = vpmovsxbd_avx2(ZEXT816(0x201f1e1d1c1b1a19));
              local_278._8_8_ = 0x1400000013;
              local_278._0_8_ = 0x1200000011;
              local_278._16_8_ = 0x1600000015;
              local_278._24_8_ = 0x1800000017;
              auVar9 = vpmovsxbd_avx2(ZEXT816(0x100f0e0d0c0b0a09));
              auVar8 = vpmovsxbd_avx2(ZEXT816(0x807060504030201));
              uVar38 = 0;
              auVar74._8_8_ = 0x8000000000000000;
              auVar74._0_8_ = 0x8000000000000000;
              auVar10 = vpcmpeqd_avx2(auVar53,auVar53);
              local_178._8_4_ = 0xffffff80;
              local_178._0_8_ = 0xffffff80ffffff80;
              local_178._12_4_ = 0xffffff80;
              local_178._16_4_ = 0xffffff80;
              local_178._20_4_ = 0xffffff80;
              local_178._24_4_ = 0xffffff80;
              local_178._28_4_ = 0xffffff80;
              local_198._8_4_ = 0xff;
              local_198._0_8_ = 0xff000000ff;
              local_198._12_4_ = 0xff;
              local_198._16_4_ = 0xff;
              local_198._20_4_ = 0xff;
              local_198._24_4_ = 0xff;
              local_198._28_4_ = 0xff;
              auVar54 = ZEXT1632(CONCAT412(4,CONCAT48(4,0x400000004)));
              local_1f8._8_4_ = 0x20;
              local_1f8._0_8_ = 0x2000000020;
              local_1f8._12_4_ = 0x20;
              local_1f8._16_4_ = 0x20;
              local_1f8._20_4_ = 0x20;
              local_1f8._24_4_ = 0x20;
              local_1f8._28_4_ = 0x20;
              local_1b8._8_8_ = 0x8000000000000000;
              local_1b8._0_8_ = 0x8000000000000000;
              local_1b8._16_8_ = 0x8000000000000000;
              local_1b8._24_8_ = 0x8000000000000000;
              do {
                auVar53._8_8_ = uVar38;
                auVar53._0_8_ = uVar38;
                auVar53._16_8_ = uVar38;
                auVar53._24_8_ = uVar38;
                auVar52 = vpor_avx2(auVar53,_DAT_00908b60);
                auVar64 = vpaddd_avx2(auVar10,auVar8);
                auVar59 = vpaddd_avx2(auVar9,auVar10);
                auVar10 = vpaddd_avx2(auVar10,auVar62);
                auVar51 = vpmulld_avx2(auVar10,local_138);
                auVar10 = vpmulld_avx2(auVar59,local_138);
                auVar64 = vpmulld_avx2(auVar64,local_138);
                auVar67 = vpcmpgtq_avx(auVar52._0_16_ ^ auVar74,auVar74 ^ auVar58);
                auVar59 = vpcmpeqd_avx2(auVar76._0_32_,auVar76._0_32_);
                auVar75 = vpsubd_avx2(local_158,auVar64);
                auVar10 = vpsubd_avx2(local_158,auVar10);
                auVar64 = vpmaxsd_avx2(auVar10,local_178);
                auVar10 = vpmaxsd_avx2(auVar75,local_178);
                auVar10 = vpand_avx2(local_198,auVar10);
                auVar64 = vpand_avx2(auVar64,local_198);
                auVar10 = vpackusdw_avx2(auVar10,auVar64);
                auVar64 = vpaddd_avx2(auVar59,local_278);
                auVar6 = vpcmpeqd_avx(auVar59._0_16_,auVar59._0_16_);
                auVar76 = ZEXT1664(auVar6);
                auVar64 = vpmulld_avx2(auVar64,local_138);
                auVar64 = vpsubd_avx2(local_158,auVar64);
                auVar59 = vpsubd_avx2(local_158,auVar51);
                auVar59 = vpmaxsd_avx2(auVar59,local_178);
                auVar64 = vpmaxsd_avx2(auVar64,local_178);
                auVar64 = vpand_avx2(auVar64,local_198);
                auVar59 = vpand_avx2(auVar59,local_198);
                auVar64 = vpackusdw_avx2(auVar64,auVar59);
                auVar10 = vpermq_avx2(auVar10,0xd8);
                auVar64 = vpermq_avx2(auVar64,0xd8);
                auVar10 = vpackuswb_avx2(auVar10,auVar64);
                auVar67 = vpackssdw_avx(auVar67,auVar67);
                auVar67 = vpackssdw_avx(auVar6 ^ auVar67,auVar6 ^ auVar67);
                auVar67 = vpacksswb_avx(auVar67,auVar67);
                auVar64 = vpermq_avx2(auVar10,0xd8);
                if ((auVar67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 1] = auVar64[0];
                }
                auVar67 = vpcmpgtq_avx(auVar52._0_16_ ^ auVar74,auVar74 ^ auVar58);
                auVar67 = vpackssdw_avx(auVar67,auVar67);
                auVar67 = vpackssdw_avx(auVar6 ^ auVar67,auVar6 ^ auVar67);
                auVar67 = vpacksswb_avx(auVar67,auVar67);
                if ((auVar67 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 2] = auVar64[1];
                }
                auVar75 = local_1b8 ^ auVar63;
                auVar59 = vpcmpgtq_avx2(auVar52 ^ local_1b8,auVar75);
                auVar51 = vpshuflw_avx2(auVar59,0xe8);
                auVar10 = vpcmpeqd_avx2(local_158,local_158);
                auVar51 = vpermd_avx2(auVar54,auVar51 ^ auVar10);
                auVar67 = vpackssdw_avx(auVar51._0_16_,auVar51._0_16_);
                auVar67 = vpacksswb_avx(auVar67,auVar67);
                if ((auVar67 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 3] = auVar64[2];
                }
                auVar67 = vpackssdw_avx(auVar59._16_16_,auVar59._16_16_);
                auVar67 = vpackssdw_avx(auVar67 ^ auVar6,auVar67 ^ auVar6);
                auVar67 = vpacksswb_avx(auVar67,auVar67);
                if ((auVar67 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 4] = auVar64[3];
                }
                auVar51 = vpor_avx2(auVar53,_DAT_00908c60);
                auVar67 = vpcmpgtq_avx(auVar51._0_16_ ^ auVar74,auVar74 ^ auVar58);
                auVar67 = vpackssdw_avx(auVar67,auVar67);
                auVar59 = vpermq_avx2(ZEXT1632(auVar67 ^ auVar6),0x55);
                auVar59 = vpackssdw_avx2(auVar59,auVar8);
                auVar67._0_2_ = auVar59._16_2_;
                auVar67._2_2_ = auVar67._0_2_;
                auVar67._4_2_ = auVar67._0_2_;
                auVar67._6_2_ = auVar67._0_2_;
                auVar67._8_2_ = auVar67._0_2_;
                auVar67._10_2_ = auVar67._0_2_;
                auVar67._12_2_ = auVar67._0_2_;
                auVar67._14_2_ = auVar67._0_2_;
                auVar67 = vpacksswb_avx(auVar67,auVar67);
                if ((auVar67 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 5] = auVar64[4];
                }
                auVar67 = vpcmpgtq_avx(auVar51._0_16_ ^ auVar74,auVar74 ^ auVar58);
                auVar67 = vpshufhw_avx(auVar67,0x84);
                auVar59 = vpermq_avx2(ZEXT1632(auVar67 ^ auVar6),0x55);
                auVar59 = vpackssdw_avx2(auVar59,auVar8);
                auVar68._0_4_ = auVar59._16_4_;
                auVar68._4_4_ = auVar68._0_4_;
                auVar68._8_4_ = auVar68._0_4_;
                auVar68._12_4_ = auVar68._0_4_;
                auVar67 = vpacksswb_avx(auVar68,auVar68);
                if ((auVar67 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 6] = auVar64[5];
                }
                auVar51 = vpcmpgtq_avx2(auVar51 ^ local_1b8,auVar75);
                auVar59 = vpackssdw_avx2(auVar8,auVar51);
                auVar67 = auVar59._16_16_ ^ auVar6;
                auVar67 = vpackssdw_avx(auVar67,auVar67);
                auVar67 = vpacksswb_avx(auVar67,auVar67);
                if ((auVar67 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 7] = auVar64[6];
                }
                auVar59 = vpshufhw_avx2(auVar51,0x84);
                auVar67 = auVar59._16_16_ ^ auVar6;
                auVar67 = vpackssdw_avx(auVar67,auVar67);
                auVar67 = vpacksswb_avx(auVar67,auVar67);
                if ((auVar67 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 8] = auVar64[7];
                }
                auVar51 = vpor_avx2(auVar53,_DAT_00908e20);
                auVar67 = vpcmpgtq_avx(auVar51._0_16_ ^ auVar74,auVar74 ^ auVar58);
                auVar67 = vpackssdw_avx(auVar67,auVar67);
                auVar67 = vpackssdw_avx(auVar67 ^ auVar6,auVar67 ^ auVar6);
                auVar59 = vpmovzxwd_avx2(auVar67);
                auVar59 = vpacksswb_avx2(auVar59,auVar8);
                if ((auVar59 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
                  ptr_00[uVar38 + 9] = auVar64[0];
                }
                auVar67 = vpcmpgtq_avx(auVar51._0_16_ ^ auVar74,auVar74 ^ auVar58);
                auVar67 = vpackssdw_avx(auVar67,auVar67);
                auVar67 = vpackssdw_avx(auVar67 ^ auVar6,auVar67 ^ auVar6);
                auVar59 = vpermq_avx2(ZEXT1632(auVar67),0x55);
                auVar59 = vpacksswb_avx2(auVar59,auVar8);
                if ((auVar59._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 10] = auVar64[1];
                }
                auVar51 = vpcmpgtq_avx2(auVar51 ^ local_1b8,auVar75);
                auVar59 = vpshuflw_avx2(auVar51,0xe8);
                auVar59 = vpermd_avx2(auVar54,auVar59 ^ auVar10);
                auVar67 = vpackssdw_avx(auVar59._0_16_,auVar59._0_16_);
                auVar59 = vpermq_avx2(ZEXT1632(auVar67),0x55);
                auVar59 = vpacksswb_avx2(auVar59,auVar8);
                if ((auVar59._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 0xb] = auVar64[2];
                }
                auVar67 = vpackssdw_avx(auVar51._16_16_,auVar51._16_16_);
                auVar67 = vpackssdw_avx(auVar67 ^ auVar6,auVar67 ^ auVar6);
                auVar59 = vpermq_avx2(ZEXT1632(auVar67),0x55);
                auVar59 = vpacksswb_avx2(auVar59,auVar8);
                if ((auVar59._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 0xc] = auVar64[3];
                }
                auVar51 = vpor_avx2(auVar53,_DAT_00908e00);
                auVar67 = vpcmpgtq_avx(auVar51._0_16_ ^ auVar74,auVar74 ^ auVar58);
                auVar67 = vpackssdw_avx(auVar67,auVar67);
                auVar59 = vpermq_avx2(ZEXT1632(auVar67 ^ auVar6),0x55);
                auVar59 = vpackssdw_avx2(auVar8,auVar59);
                auVar59 = vpacksswb_avx2(auVar59,auVar8);
                if ((auVar59._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 0xd] = auVar64[4];
                }
                auVar67 = vpcmpgtq_avx(auVar51._0_16_ ^ auVar74,auVar74 ^ auVar58);
                auVar67 = vpshufhw_avx(auVar67,0x84);
                auVar59 = vpermq_avx2(ZEXT1632(auVar67 ^ auVar6),0x55);
                auVar59 = vpackssdw_avx2(auVar8,auVar59);
                auVar59 = vpacksswb_avx2(auVar59,auVar8);
                if ((auVar59._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 0xe] = auVar64[5];
                }
                auVar51 = vpcmpgtq_avx2(auVar51 ^ local_1b8,auVar75);
                auVar59 = vpackssdw_avx2(auVar8,auVar51);
                auVar59 = vpackssdw_avx2(auVar8,auVar59 ^ auVar10);
                auVar59 = vpacksswb_avx2(auVar59,auVar8);
                if ((auVar59._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 0xf] = auVar64[6];
                }
                auVar59 = vpshufhw_avx2(auVar51,0x84);
                auVar59 = vpackssdw_avx2(auVar8,auVar59 ^ auVar10);
                auVar59 = vpacksswb_avx2(auVar59,auVar8);
                if ((auVar59._16_16_ >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 0x10] = auVar64[7];
                }
                auVar59 = vpor_avx2(auVar53,_DAT_00908f80);
                auVar67 = vpcmpgtq_avx(auVar59._0_16_ ^ auVar74,auVar74 ^ auVar58);
                auVar67 = vpackssdw_avx(auVar67,auVar67);
                auVar67 = vpackssdw_avx(auVar67 ^ auVar6,auVar67 ^ auVar6);
                auVar67 = vpacksswb_avx(auVar67,auVar67);
                if ((auVar67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 0x11] = auVar64[0x10];
                }
                auVar67 = vpcmpgtq_avx(auVar59._0_16_ ^ auVar74,auVar74 ^ auVar58);
                auVar67 = vpackssdw_avx(auVar67,auVar67);
                auVar67 = vpackssdw_avx(auVar67 ^ auVar6,auVar67 ^ auVar6);
                auVar67 = vpacksswb_avx(auVar67,auVar67);
                if ((auVar67 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 0x12] = auVar64[0x11];
                }
                auVar59 = vpcmpgtq_avx2(auVar59 ^ local_1b8,auVar75);
                auVar51 = vpshuflw_avx2(auVar59,0xe8);
                auVar51 = vpermd_avx2(auVar54,auVar51 ^ auVar10);
                auVar67 = vpackssdw_avx(auVar51._0_16_,auVar51._0_16_);
                auVar67 = vpacksswb_avx(auVar67,auVar67);
                if ((auVar67 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 0x13] = auVar64[0x12];
                }
                auVar67 = vpackssdw_avx(auVar59._16_16_,auVar59._16_16_);
                auVar67 = vpackssdw_avx(auVar67 ^ auVar6,auVar67 ^ auVar6);
                auVar67 = vpacksswb_avx(auVar67,auVar67);
                if ((auVar67 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 0x14] = auVar64[0x13];
                }
                auVar51 = vpor_avx2(auVar53,_DAT_00908f60);
                auVar67 = vpcmpgtq_avx(auVar51._0_16_ ^ auVar74,auVar74 ^ auVar58);
                auVar67 = vpackssdw_avx(auVar67,auVar67);
                auVar59 = vpermq_avx2(ZEXT1632(auVar67 ^ auVar6),0x55);
                auVar59 = vpackssdw_avx2(auVar59,auVar8);
                auVar69._0_2_ = auVar59._16_2_;
                auVar69._2_2_ = auVar69._0_2_;
                auVar69._4_2_ = auVar69._0_2_;
                auVar69._6_2_ = auVar69._0_2_;
                auVar69._8_2_ = auVar69._0_2_;
                auVar69._10_2_ = auVar69._0_2_;
                auVar69._12_2_ = auVar69._0_2_;
                auVar69._14_2_ = auVar69._0_2_;
                auVar67 = vpacksswb_avx(auVar69,auVar69);
                if ((auVar67 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 0x15] = auVar64[0x14];
                }
                auVar67 = vpcmpgtq_avx(auVar51._0_16_ ^ auVar74,auVar74 ^ auVar58);
                auVar67 = vpshufhw_avx(auVar67,0x84);
                auVar59 = vpermq_avx2(ZEXT1632(auVar67 ^ auVar6),0x55);
                auVar59 = vpackssdw_avx2(auVar59,auVar8);
                auVar70._0_4_ = auVar59._16_4_;
                auVar70._4_4_ = auVar70._0_4_;
                auVar70._8_4_ = auVar70._0_4_;
                auVar70._12_4_ = auVar70._0_4_;
                auVar67 = vpacksswb_avx(auVar70,auVar70);
                if ((auVar67 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 0x16] = auVar64[0x15];
                }
                auVar51 = vpcmpgtq_avx2(auVar51 ^ local_1b8,auVar75);
                auVar59 = vpackssdw_avx2(auVar8,auVar51);
                auVar67 = auVar59._16_16_ ^ auVar6;
                auVar67 = vpackssdw_avx(auVar67,auVar67);
                auVar67 = vpacksswb_avx(auVar67,auVar67);
                if ((auVar67 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 0x17] = auVar64[0x16];
                }
                auVar59 = vpshufhw_avx2(auVar51,0x84);
                auVar67 = auVar59._16_16_ ^ auVar6;
                auVar67 = vpackssdw_avx(auVar67,auVar67);
                auVar67 = vpacksswb_avx(auVar67,auVar67);
                if ((auVar67 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 0x18] = auVar64[0x17];
                }
                auVar51 = vpor_avx2(auVar53,_DAT_00908f40);
                auVar67 = vpcmpgtq_avx(auVar51._0_16_ ^ auVar74,auVar74 ^ auVar58);
                auVar67 = vpackssdw_avx(auVar67,auVar67);
                auVar67 = vpackssdw_avx(auVar67 ^ auVar6,auVar67 ^ auVar6);
                auVar59 = vpmovzxwd_avx2(auVar67);
                auVar59 = vpacksswb_avx2(auVar8,auVar59);
                if ((auVar59 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
                  ptr_00[uVar38 + 0x19] = auVar64[0x10];
                }
                auVar67 = vpcmpgtq_avx(auVar51._0_16_ ^ auVar74,auVar74 ^ auVar58);
                auVar67 = vpackssdw_avx(auVar67,auVar67);
                auVar67 = vpackssdw_avx(auVar67 ^ auVar6,auVar67 ^ auVar6);
                auVar59 = vpermq_avx2(ZEXT1632(auVar67),0x55);
                auVar59 = vpacksswb_avx2(auVar8,auVar59);
                if ((auVar59._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 0x1a] = auVar64[0x11];
                }
                auVar51 = vpcmpgtq_avx2(auVar51 ^ local_1b8,auVar75);
                auVar59 = vpshuflw_avx2(auVar51,0xe8);
                auVar59 = vpermd_avx2(auVar54,auVar59 ^ auVar10);
                auVar67 = vpackssdw_avx(auVar59._0_16_,auVar59._0_16_);
                auVar59 = vpermq_avx2(ZEXT1632(auVar67),0x55);
                auVar59 = vpacksswb_avx2(auVar8,auVar59);
                if ((auVar59._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 0x1b] = auVar64[0x12];
                }
                auVar67 = vpackssdw_avx(auVar51._16_16_,auVar51._16_16_);
                auVar67 = vpackssdw_avx(auVar67 ^ auVar6,auVar67 ^ auVar6);
                auVar59 = vpermq_avx2(ZEXT1632(auVar67),0x55);
                auVar59 = vpacksswb_avx2(auVar8,auVar59);
                if ((auVar59._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 0x1c] = auVar64[0x13];
                }
                auVar51 = vpor_avx2(auVar53,_DAT_00908f20);
                auVar67 = vpcmpgtq_avx(auVar74 ^ auVar51._0_16_,auVar74 ^ auVar58);
                auVar67 = vpackssdw_avx(auVar67,auVar67);
                auVar59 = vpermq_avx2(ZEXT1632(auVar67 ^ auVar6),0x55);
                auVar59 = vpackssdw_avx2(auVar8,auVar59);
                auVar59 = vpacksswb_avx2(auVar8,auVar59);
                if ((auVar59._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 0x1d] = auVar64[0x14];
                }
                auVar67 = vpcmpgtq_avx(auVar74 ^ auVar51._0_16_,auVar74 ^ auVar58);
                auVar67 = vpshufhw_avx(auVar67,0x84);
                auVar59 = vpermq_avx2(ZEXT1632(auVar67 ^ auVar6),0x55);
                auVar59 = vpackssdw_avx2(auVar8,auVar59);
                auVar59 = vpacksswb_avx2(auVar8,auVar59);
                if ((auVar59._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 0x1e] = auVar64[0x15];
                }
                auVar51 = vpcmpgtq_avx2(local_1b8 ^ auVar51,auVar75);
                auVar59 = vpackssdw_avx2(auVar8,auVar51);
                auVar59 = vpackssdw_avx2(auVar8,auVar10 ^ auVar59);
                auVar59 = vpacksswb_avx2(auVar8,auVar59);
                if ((auVar59._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 0x1f] = auVar64[0x16];
                }
                auVar59 = vpshufhw_avx2(auVar51,0x84);
                auVar59 = vpackssdw_avx2(auVar8,auVar10 ^ auVar59);
                auVar59 = vpacksswb_avx2(auVar8,auVar59);
                if ((auVar59._16_16_ >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_00[uVar38 + 0x20] = auVar64[0x17];
                }
                uVar38 = uVar38 + 0x20;
                auVar8 = vpaddd_avx2(auVar8,local_1f8);
                auVar9 = vpaddd_avx2(auVar9,local_1f8);
                local_278 = vpaddd_avx2(local_278,local_1f8);
                auVar62 = vpaddd_avx2(auVar62,local_1f8);
              } while ((s2Len + 0x1fU & 0xffffffe0) != uVar38);
              alVar17 = (__m256i)vpsubsb_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar56);
              iVar37 = (int)size;
              palVar39 = ptr_03 + (iVar37 - 1U);
              auVar8[1] = bVar47;
              auVar8[0] = bVar47;
              auVar8[2] = bVar47;
              auVar8[3] = bVar47;
              auVar8[4] = bVar47;
              auVar8[5] = bVar47;
              auVar8[6] = bVar47;
              auVar8[7] = bVar47;
              auVar8[8] = bVar47;
              auVar8[9] = bVar47;
              auVar8[10] = bVar47;
              auVar8[0xb] = bVar47;
              auVar8[0xc] = bVar47;
              auVar8[0xd] = bVar47;
              auVar8[0xe] = bVar47;
              auVar8[0xf] = bVar47;
              auVar8[0x10] = bVar47;
              auVar8[0x11] = bVar47;
              auVar8[0x12] = bVar47;
              auVar8[0x13] = bVar47;
              auVar8[0x14] = bVar47;
              auVar8[0x15] = bVar47;
              auVar8[0x16] = bVar47;
              auVar8[0x17] = bVar47;
              auVar8[0x18] = bVar47;
              auVar8[0x19] = bVar47;
              auVar8[0x1a] = bVar47;
              auVar8[0x1b] = bVar47;
              auVar8[0x1c] = bVar47;
              auVar8[0x1d] = bVar47;
              auVar8[0x1e] = bVar47;
              auVar8[0x1f] = bVar47;
              uVar38 = size;
              do {
                *palVar39 = alVar17;
                alVar17 = (__m256i)vpsubsb_avx2((undefined1  [32])alVar17,auVar57);
                palVar39 = palVar39 + -1;
                iVar43 = (int)uVar38;
                uVar40 = iVar43 - 1;
                uVar38 = (ulong)uVar40;
              } while (uVar40 != 0 && 0 < iVar43);
              lVar42 = size * 0x20;
              auVar76 = ZEXT3264(auVar8);
              auVar9[1] = cVar46;
              auVar9[0] = cVar46;
              auVar9[2] = cVar46;
              auVar9[3] = cVar46;
              auVar9[4] = cVar46;
              auVar9[5] = cVar46;
              auVar9[6] = cVar46;
              auVar9[7] = cVar46;
              auVar9[8] = cVar46;
              auVar9[9] = cVar46;
              auVar9[10] = cVar46;
              auVar9[0xb] = cVar46;
              auVar9[0xc] = cVar46;
              auVar9[0xd] = cVar46;
              auVar9[0xe] = cVar46;
              auVar9[0xf] = cVar46;
              auVar9[0x10] = cVar46;
              auVar9[0x11] = cVar46;
              auVar9[0x12] = cVar46;
              auVar9[0x13] = cVar46;
              auVar9[0x14] = cVar46;
              auVar9[0x15] = cVar46;
              auVar9[0x16] = cVar46;
              auVar9[0x17] = cVar46;
              auVar9[0x18] = cVar46;
              auVar9[0x19] = cVar46;
              auVar9[0x1a] = cVar46;
              auVar9[0x1b] = cVar46;
              auVar9[0x1c] = cVar46;
              auVar9[0x1d] = cVar46;
              auVar9[0x1e] = cVar46;
              auVar9[0x1f] = cVar46;
              auVar55 = ZEXT3264(auVar9);
              uVar38 = 0;
              do {
                auVar58 = SUB3216(ptr_02[iVar37 - 1U],0);
                auVar62._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar76._0_16_;
                auVar62._16_16_ = ZEXT116(0) * auVar76._16_16_ + ZEXT116(1) * auVar58;
                auVar62 = vpalignr_avx2((undefined1  [32])ptr_02[iVar37 - 1U],auVar62,0xf);
                auVar58 = vpinsrb_avx(auVar62._0_16_,(uint)(byte)ptr_00[uVar38],0);
                auVar62 = vpblendd_avx2(auVar62,ZEXT1632(auVar58),0xf);
                iVar43 = ppVar3->mapper[(byte)s2[uVar38]];
                auVar54 = vpsubsb_avx2(auVar8,(undefined1  [32])*ptr_03);
                lVar44 = 0;
                auVar10 = auVar8;
                do {
                  auVar63 = vpaddsb_avx2(auVar62,*(undefined1 (*) [32])
                                                  ((long)pvVar2 +
                                                  lVar44 + size * (long)iVar43 * 0x20));
                  auVar62 = *(undefined1 (*) [32])((long)*ptr_02 + lVar44);
                  auVar64 = vpsubsb_avx2(*(undefined1 (*) [32])((long)*ptr + lVar44),auVar57);
                  auVar59 = vpsubsb_avx2(auVar62,auVar56);
                  auVar64 = vpmaxsb_avx2(auVar64,auVar59);
                  auVar54 = vpaddsb_avx2(auVar54,*(undefined1 (*) [32])((long)*ptr_03 + lVar44));
                  auVar10 = vpmaxsb_avx2(auVar10,auVar54);
                  auVar54 = vpmaxsb_avx2(auVar64,auVar63);
                  *(undefined1 (*) [32])((long)*ptr + lVar44) = auVar64;
                  *(undefined1 (*) [32])((long)*ptr_01 + lVar44) = auVar54;
                  lVar44 = lVar44 + 0x20;
                } while (lVar42 != lVar44);
                auVar64._0_16_ = ZEXT116(0) * auVar54._0_16_ + ZEXT116(1) * auVar76._0_16_;
                auVar64._16_16_ = ZEXT116(0) * auVar76._16_16_ + ZEXT116(1) * auVar54._0_16_;
                auVar62 = vpalignr_avx2(auVar54,auVar64,0xf);
                uVar45 = uVar38 + 1;
                auVar58 = vpinsrb_avx(auVar62._0_16_,(uint)(byte)ptr_00[uVar38 + 1],0);
                auVar54 = vpblendd_avx2(auVar62,ZEXT1632(auVar58),0xf);
                auVar62 = vpaddsb_avx2(auVar54,(undefined1  [32])*ptr_03);
                auVar62 = vpmaxsb_avx2(auVar10,auVar62);
                iVar43 = 0x1e;
                do {
                  auVar10 = vperm2i128_avx2(auVar62,auVar62,0x28);
                  auVar10 = vpalignr_avx2(auVar62,auVar10,0xf);
                  auVar10 = vpaddsb_avx2(auVar50,auVar10);
                  auVar62 = vpmaxsb_avx2(auVar62,auVar10);
                  iVar43 = iVar43 + -1;
                } while (iVar43 != 0);
                auVar10 = vperm2i128_avx2(auVar62,auVar62,0x28);
                auVar62 = vpalignr_avx2(auVar62,auVar10,0xf);
                auVar62 = vpaddsb_avx2(ZEXT132(bVar47),auVar62);
                auVar10 = vpmaxsb_avx2(auVar54,auVar62);
                lVar44 = 0;
                do {
                  auVar62 = vpsubsb_avx2(auVar62,auVar57);
                  auVar10 = vpsubsb_avx2(auVar10,auVar56);
                  auVar62 = vpmaxsb_avx2(auVar62,auVar10);
                  auVar10 = vpmaxsb_avx2(auVar62,*(undefined1 (*) [32])((long)*ptr_01 + lVar44));
                  *(undefined1 (*) [32])((long)*ptr_02 + lVar44) = auVar10;
                  auVar63 = vpminsb_avx2(auVar55._0_32_,auVar10);
                  auVar55 = ZEXT3264(auVar63);
                  auVar54 = vpmaxsb_avx2(auVar76._0_32_,auVar10);
                  auVar76 = ZEXT3264(auVar54);
                  lVar44 = lVar44 + 0x20;
                } while (lVar42 != lVar44);
                alVar17 = ptr_02[uVar5];
                cVar46 = alVar17[2]._7_1_;
                if (iVar33 < 0x1f) {
                  iVar43 = 0;
                  do {
                    auVar62 = vperm2i128_avx2((undefined1  [32])alVar17,(undefined1  [32])alVar17,
                                              0x28);
                    alVar17 = (__m256i)vpalignr_avx2((undefined1  [32])alVar17,auVar62,0xf);
                    cVar46 = alVar17[2]._7_1_;
                    iVar43 = iVar43 + 1;
                  } while (iVar43 < 0x1f - iVar33);
                }
                ((ppVar34->field_4).rowcols)->score_row[uVar38] = (int)cVar46;
                uVar38 = uVar45;
              } while (uVar45 != (uint)s2Len);
              uVar38 = (ulong)(uint)(iVar37 * 4);
              uVar45 = 0;
              do {
                piVar4 = ((ppVar34->field_4).rowcols)->score_col;
                plVar1 = *ptr_02 + uVar45;
                lVar30 = *plVar1;
                cVar46 = *(char *)((long)plVar1 + 1);
                cVar35 = *(char *)((long)plVar1 + 2);
                cVar18 = *(char *)((long)plVar1 + 3);
                cVar19 = *(char *)((long)plVar1 + 4);
                cVar20 = *(char *)((long)plVar1 + 5);
                cVar21 = *(char *)((long)plVar1 + 6);
                cVar22 = *(char *)((long)plVar1 + 7);
                plVar1 = *ptr_02 + uVar45 + 2;
                lVar31 = *plVar1;
                cVar23 = *(char *)((long)plVar1 + 1);
                cVar24 = *(char *)((long)plVar1 + 2);
                cVar25 = *(char *)((long)plVar1 + 3);
                cVar26 = *(char *)((long)plVar1 + 4);
                cVar27 = *(char *)((long)plVar1 + 5);
                cVar28 = *(char *)((long)plVar1 + 6);
                cVar29 = *(char *)((long)plVar1 + 7);
                *(int *)((long)piVar4 + uVar45) = (int)(char)lVar30;
                *(int *)((long)piVar4 + uVar38 + uVar45) = (int)cVar46;
                *(int *)((long)piVar4 + (uint)(iVar37 * 8) + uVar45) = (int)cVar35;
                *(int *)((long)piVar4 + uVar38 * 3 + uVar45) = (int)cVar18;
                *(int *)((long)piVar4 + (uint)(iVar37 << 4) + uVar45) = (int)cVar19;
                *(int *)((long)piVar4 + uVar38 * 5 + uVar45) = (int)cVar20;
                *(int *)((long)piVar4 + (ulong)(uint)(iVar37 * 8) * 3 + uVar45) = (int)cVar21;
                *(int *)((long)piVar4 + size * 0x1c + uVar45) = (int)cVar22;
                *(int *)((long)piVar4 + lVar42 + uVar45) = (int)(char)lVar30;
                *(int *)((long)piVar4 + (ulong)(uint)(iVar37 * 4) * 9 + uVar45) = (int)cVar46;
                *(int *)((long)piVar4 + (ulong)(uint)(iVar37 * 8) * 5 + uVar45) = (int)cVar35;
                *(int *)((long)piVar4 + size * 0x2c + uVar45) = (int)cVar18;
                *(int *)((long)piVar4 + (ulong)(uint)(iVar37 << 4) * 3 + uVar45) = (int)cVar19;
                *(int *)((long)piVar4 + size * 0x34 + uVar45) = (int)cVar20;
                *(int *)((long)piVar4 + size * 0x38 + uVar45) = (int)cVar21;
                *(int *)((long)piVar4 + size * 0x3c + uVar45) = (int)cVar22;
                *(int *)((long)piVar4 + size * 0x40 + uVar45) = (int)(char)lVar31;
                *(int *)((long)piVar4 + size * 0x40 + (ulong)(uint)(iVar37 * 4) + uVar45) =
                     (int)cVar23;
                *(int *)((long)piVar4 + (ulong)(uint)(iVar37 * 8) * 9 + uVar45) = (int)cVar24;
                *(int *)((long)piVar4 + size * 0x4c + uVar45) = (int)cVar25;
                *(int *)((long)piVar4 + (ulong)(uint)(iVar37 << 4) * 5 + uVar45) = (int)cVar26;
                *(int *)((long)piVar4 + size * 0x54 + uVar45) = (int)cVar27;
                *(int *)((long)piVar4 + size * 0x58 + uVar45) = (int)cVar28;
                *(int *)((long)piVar4 + size * 0x5c + uVar45) = (int)cVar29;
                *(int *)((long)piVar4 + size * 0x60 + uVar45) = (int)(char)lVar31;
                *(int *)((long)piVar4 + size * 100 + uVar45) = (int)cVar23;
                *(int *)((long)piVar4 + size * 0x68 + uVar45) = (int)cVar24;
                *(int *)((long)piVar4 + size * 0x6c + uVar45) = (int)cVar25;
                *(int *)((long)piVar4 + size * 0x70 + uVar45) = (int)cVar26;
                *(int *)((long)piVar4 + size * 0x74 + uVar45) = (int)cVar27;
                *(int *)((long)piVar4 + size * 0x78 + uVar45) = (int)cVar28;
                *(int *)((long)piVar4 + size * 0x7c + uVar45) = (int)cVar29;
                uVar45 = uVar45 + 4;
              } while (uVar38 != uVar45);
              alVar17 = ptr_02[uVar5];
              cVar46 = alVar17[2]._7_1_;
              if (iVar33 < 0x1f) {
                iVar37 = 0;
                do {
                  auVar50 = vperm2i128_avx2((undefined1  [32])alVar17,(undefined1  [32])alVar17,0x28
                                           );
                  alVar17 = (__m256i)vpalignr_avx2((undefined1  [32])alVar17,auVar50,0xf);
                  cVar46 = alVar17[2]._7_1_;
                  iVar37 = iVar37 + 1;
                } while (iVar37 < 0x1f - iVar33);
              }
              auVar50 = vpcmpgtb_avx2(auVar8,auVar63);
              auVar8 = vpcmpgtb_avx2(auVar54,auVar9);
              auVar50 = vpor_avx2(auVar8,auVar50);
              if ((((((((((((((((((((((((((((((((auVar50 >> 7 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0 ||
                                               (auVar50 >> 0xf & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar50 >> 0x17 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar50 >> 0x1f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar50 >> 0x27 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar50 >> 0x2f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar50 >> 0x37 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar50 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar50 >> 0x47 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar50 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar50 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar50 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar50 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar50 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar50 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar50 >> 0x7f,0) != '\0') ||
                                (auVar50 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar50 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar50 >> 0x97 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar50 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar50 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar50 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar50 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar50 >> 0xbf,0) != '\0') ||
                        (auVar50 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar50 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar50 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar50 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar50 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar50 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar50 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  auVar50[0x1f] < '\0') {
                *(byte *)&ppVar34->flag = (byte)ppVar34->flag | 0x40;
                cVar46 = '\0';
                iVar36 = 0;
                uVar32 = 0;
              }
              ppVar34->score = (int)cVar46;
              ppVar34->end_query = uVar32;
              ppVar34->end_ref = iVar36;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar34;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    __m256i vZero;
    int8_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi8_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi8(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi8(-segLen*gap), 1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int8_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_8_t h;
            __m256i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_subs_epi8(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_subs_epi8(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 1);
        vHp = _mm256_insert_epi8_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_subs_epi8(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi8(
                    _mm256_subs_epi8(vE, vGapE),
                    _mm256_subs_epi8(vH, vGapO));
            vHp = _mm256_adds_epi8(vHp, vW);
            vF = _mm256_max_epi8(vF, _mm256_adds_epi8(vHt, pvGapper[i]));
            vHt = _mm256_max_epi8(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 1);
        vHt = _mm256_insert_epi8_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi8(vF, _mm256_adds_epi8(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 1);
            vFt = _mm256_adds_epi8(vFt, vSegLenXgap);
            vF = _mm256_max_epi8(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 1);
        vF = _mm256_adds_epi8(vF, vNegInfFront);
        vH = _mm256_max_epi8(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi8(
                    _mm256_subs_epi8(vF, vGapE),
                    _mm256_subs_epi8(vH, vGapO));
            vH = _mm256_max_epi8(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 1);
        }
        score = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}